

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O1

void __thiscall cmdline::cmdline_error::cmdline_error(cmdline_error *this,string *msg)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__cmdline_error_0010db50;
  (this->msg)._M_dataplus._M_p = (pointer)&(this->msg).field_2;
  pcVar1 = (msg->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->msg,pcVar1,pcVar1 + msg->_M_string_length);
  return;
}

Assistant:

cmdline_error(const std::string &msg): msg(msg){}